

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

char32_t * __thiscall kj::Vector<char32_t>::add<char32_t&>(Vector<char32_t> *this,char32_t *params)

{
  bool bVar1;
  char32_t *pcVar2;
  char32_t *params_local;
  Vector<char32_t> *this_local;
  
  bVar1 = ArrayBuilder<char32_t>::isFull(&this->builder);
  if (bVar1) {
    grow(this,0);
  }
  pcVar2 = fwd<char32_t&>(params);
  pcVar2 = ArrayBuilder<char32_t>::add<char32_t&>(&this->builder,pcVar2);
  return pcVar2;
}

Assistant:

inline T& add(Params&&... params) KJ_LIFETIMEBOUND {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }